

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_can_descend(archive *_a)

{
  archive_vtable_conflict *paVar1;
  int iVar2;
  bool local_2d;
  wchar_t magic_test;
  tree *t;
  archive_read_disk *a;
  archive *_a_local;
  
  paVar1 = _a[1].vtable;
  iVar2 = __archive_check_magic(_a,0xbadb0c5,6,"archive_read_disk_can_descend");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    local_2d = false;
    if (*(int *)((long)&paVar1->archive_read_next_header + 4) == 1) {
      local_2d = *(int *)&paVar1[4].archive_close != 0;
    }
    _a_local._4_4_ = (wchar_t)local_2d;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_can_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_can_descend");

	return (t->visit_type == TREE_REGULAR && t->descend);
}